

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sight.cpp
# Opt level: O3

int __thiscall SightCheck::init(SightCheck *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  sector_t_conflict *in_RCX;
  AActor *in_RDX;
  double *in_R8;
  int in_R9D;
  undefined4 uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  iVar1 = *(int *)((long)in_R8 + 0x1c);
  dVar9 = 0.0;
  dVar10 = 0.0;
  dVar6 = 0.0;
  dVar8 = 0.0;
  if (*(int *)(*(long *)(ctx + 0x130) + 0x208) != iVar1) {
    dVar6 = Displacements.data.Array
            [Displacements.size * iVar1 + *(int *)(*(long *)(ctx + 0x130) + 0x208)].pos.X;
    dVar8 = Displacements.data.Array
            [Displacements.size * iVar1 + *(int *)(*(long *)(ctx + 0x130) + 0x208)].pos.Y;
  }
  dVar6 = *(double *)(ctx + 0x48) + dVar6;
  dVar8 = *(double *)(ctx + 0x50) + dVar8;
  uVar5 = (undefined4)((ulong)dVar8 >> 0x20);
  dVar7 = *(double *)(ctx + 0x58);
  auVar3._8_4_ = SUB84(dVar8,0);
  auVar3._0_8_ = dVar6;
  auVar3._12_4_ = uVar5;
  (this->sightstart).X = dVar6;
  (this->sightstart).Y = (double)auVar3._8_8_;
  iVar2 = in_RDX->Sector->PortalGroup;
  if (iVar2 != iVar1) {
    dVar9 = Displacements.data.Array[iVar1 * Displacements.size + iVar2].pos.X;
    dVar10 = Displacements.data.Array[iVar1 * Displacements.size + iVar2].pos.Y;
  }
  dVar9 = (in_RDX->__Pos).X + dVar9;
  dVar10 = (in_RDX->__Pos).Y + dVar10;
  (this->sightend).X = dVar9;
  (this->sightend).Y = dVar10;
  dVar7 = dVar7 + *(double *)(ctx + 0x180) * 0.75;
  (this->sightstart).Z = dVar7;
  this->Startfrac = *in_R8;
  auVar4._8_4_ = SUB84(dVar8,0);
  auVar4._0_8_ = dVar6;
  auVar4._12_4_ = uVar5;
  (this->Trace).x = dVar6;
  (this->Trace).y = (double)auVar4._8_8_;
  (this->Trace).dx = dVar9 - dVar6;
  (this->Trace).dy = dVar10 - dVar8;
  this->Lastzbottom = dVar7;
  this->Lastztop = dVar7;
  this->lastsector = in_RCX;
  this->seeingthing = in_RDX;
  dVar6 = in_R8[2];
  this->topslope = in_R8[1];
  this->bottomslope = dVar6;
  this->Flags = in_R9D;
  iVar1 = *(int *)(in_R8 + 3);
  this->portaldir = iVar1;
  this->portalfound = false;
  this->myseethrough = 0x2000000;
  return iVar1;
}

Assistant:

void init(AActor * t1, AActor * t2, sector_t *startsector, SightTask *task, int flags)
	{
		sightstart = t1->PosRelative(task->portalgroup);
		sightend = t2->PosRelative(task->portalgroup);
		sightstart.Z += t1->Height * 0.75;

		Startfrac = task->Frac;
		Trace = { sightstart.X, sightstart.Y, sightend.X - sightstart.X, sightend.Y - sightstart.Y };
		Lastztop = Lastzbottom = sightstart.Z;
		lastsector = startsector;
		seeingthing=t2;
		topslope = task->topslope;
		bottomslope = task->bottomslope;
		Flags = flags;
		portaldir = task->direction;
		portalfound = false;

		myseethrough = FF_SEETHROUGH;
	}